

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

bool __thiscall ConditionalExecution::verifySameCondition(ConditionalExecution *this)

{
  bool bVar1;
  int iVar2;
  OpCode OVar3;
  int4 iVar4;
  undefined4 extraout_var;
  int4 multislot;
  undefined1 local_80 [8];
  ConditionMarker tester;
  PcodeOp *init_cbranch;
  ConditionalExecution *this_local;
  
  iVar2 = (*(this->initblock->super_FlowBlock)._vptr_FlowBlock[0xe])();
  tester._88_8_ = CONCAT44(extraout_var,iVar2);
  if ((PcodeOp *)tester._88_8_ == (PcodeOp *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    OVar3 = PcodeOp::code((PcodeOp *)tester._88_8_);
    if (OVar3 == CPUI_CBRANCH) {
      ConditionMarker::ConditionMarker((ConditionMarker *)local_80);
      bVar1 = ConditionMarker::verifyCondition
                        ((ConditionMarker *)local_80,this->cbranch,(PcodeOp *)tester._88_8_);
      if (bVar1) {
        bVar1 = ConditionMarker::getFlip((ConditionMarker *)local_80);
        if (bVar1) {
          this->init2a_true = (bool)((this->init2a_true ^ 0xffU) & 1);
        }
        iVar4 = ConditionMarker::getMultiSlot((ConditionMarker *)local_80);
        if (iVar4 != -1) {
          this->directsplit = true;
          this->posta_outslot = (uint)(iVar4 != this->prea_inslot);
          if ((this->init2a_true & 1U) != 0) {
            this->posta_outslot = 1 - this->posta_outslot;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      ConditionMarker::~ConditionMarker((ConditionMarker *)local_80);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ConditionalExecution::verifySameCondition(void)

{
  PcodeOp *init_cbranch = initblock->lastOp();
  if (init_cbranch == (PcodeOp *)0) return false;
  if (init_cbranch->code() != CPUI_CBRANCH) return false;

  ConditionMarker tester;
  if (!tester.verifyCondition(cbranch,init_cbranch))
    return false;

  if (tester.getFlip())
    init2a_true = !init2a_true;
  int4 multislot = tester.getMultiSlot();
  if (multislot != -1) {
    // This is a direct split
    directsplit = true;
    posta_outslot = (multislot == prea_inslot) ? 0 : 1;
    if (init2a_true)
      posta_outslot = 1 - posta_outslot;
  }
  return true;
}